

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SymmetricOuterEdgeCase::SymmetricOuterEdgeCase
          (SymmetricOuterEdgeCase *this,Context *context,char *name,char *description,
          TessPrimitiveType primType,SpacingMode spacing,Winding winding,bool usePointMode)

{
  bool usePointMode_local;
  SpacingMode spacing_local;
  TessPrimitiveType primType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  SymmetricOuterEdgeCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SymmetricOuterEdgeCase_032bee68;
  this->m_primitiveType = primType;
  this->m_spacing = spacing;
  this->m_winding = winding;
  this->m_usePointMode = usePointMode;
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&this->m_program);
  return;
}

Assistant:

SymmetricOuterEdgeCase (Context& context, const char* name, const char* description, TessPrimitiveType primType, SpacingMode spacing, Winding winding, bool usePointMode)
		: TestCase			(context, name, description)
		, m_primitiveType	(primType)
		, m_spacing			(spacing)
		, m_winding			(winding)
		, m_usePointMode	(usePointMode)
	{
	}